

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O1

HT_FileDumpListener *
ht_file_dump_listener_register
          (HT_Timeline *timeline,char *filename,size_t buffer_size,HT_ErrorCode *out_err)

{
  HT_FileDumpListener *listener;
  HT_ErrorCode err;
  HT_ErrorCode local_1c;
  
  local_1c = HT_ERR_OK;
  listener = ht_file_dump_listener_create(filename,buffer_size,&local_1c);
  if (listener != (HT_FileDumpListener *)0x0) {
    local_1c = ht_timeline_listener_container_register_listener
                         (timeline->listeners,ht_file_dump_listener_callback,listener,
                          ht_file_dump_listener_destroy);
    if (local_1c == HT_ERR_OK) goto LAB_0010925c;
    ht_file_dump_listener_destroy(listener);
  }
  listener = (HT_FileDumpListener *)0x0;
LAB_0010925c:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = local_1c;
  }
  return listener;
}

Assistant:

HT_FileDumpListener*
ht_file_dump_listener_register(
        HT_Timeline* timeline, const char* filename, size_t buffer_size, HT_ErrorCode *out_err)
{
    HT_ErrorCode err = HT_ERR_OK;
    HT_FileDumpListener* listener = ht_file_dump_listener_create(filename, buffer_size, &err);

    if (!listener)
    {
        goto register_done;
    }

    err = ht_timeline_register_listener_full(
                timeline,
                ht_file_dump_listener_callback,
                listener,
                (HT_DestroyCallback)ht_file_dump_listener_destroy);
    if (err != HT_ERR_OK)
    {
        ht_file_dump_listener_destroy(listener);
        listener = NULL;
    }

register_done:
    HT_SET_ERROR(out_err, err);
    return listener;
}